

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O0

int __thiscall n_pca::NPca::detector(NPca *this,string *image_path)

{
  byte bVar1;
  long lVar2;
  Mat local_f0 [96];
  undefined4 local_90;
  string local_80 [8];
  Mat image;
  string *image_path_local;
  NPca *this_local;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    printf("couldn\'t find image_path\n");
    this_local._4_4_ = -1;
  }
  else {
    cv::imread(local_80,(int)image_path);
    bVar1 = cv::Mat::empty();
    if ((bVar1 & 1) == 0) {
      cv::Mat::Mat(local_f0,(Mat *)local_80);
      this_local._4_4_ = detector(this,local_f0);
      cv::Mat::~Mat(local_f0);
    }
    else {
      printf("open image failde!\n");
      this_local._4_4_ = -1;
    }
    local_90 = 1;
    cv::Mat::~Mat((Mat *)local_80);
  }
  return this_local._4_4_;
}

Assistant:

int NPca::detector(const std::string image_path)
{
    if (image_path.length() <= 0)
    {
        printf("couldn't find image_path\n");
        return -1;
    }

    Mat image = imread(image_path, IMREAD_GRAYSCALE);

    if (image.empty())
    {
        printf("open image failde!\n");
        return -1;
    }
    return detector(image);
}